

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleLinear1D(tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,IVec2 *offset)

{
  bool bVar1;
  int iVar2;
  deInt32 dVar3;
  int iVar4;
  int x;
  TextureFormat *pTVar5;
  float s;
  Vector<float,_4> VVar6;
  Vec4 VVar7;
  byte local_a9;
  byte local_8d;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  undefined1 local_6c [8];
  Vec4 p1;
  Vec4 p0;
  bool i1UseBorder;
  bool i0UseBorder;
  float a;
  int i1;
  int i0;
  int x1;
  int x0;
  int w;
  IVec2 *offset_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar2 = ConstPixelBufferAccess::getWidth(access);
  dVar3 = deFloorFloatToInt32(u - 0.5);
  iVar4 = Vector<int,_2>::x(offset);
  x = wrap(sampler->wrapS,dVar3 + iVar4,iVar2);
  iVar4 = wrap(sampler->wrapS,dVar3 + iVar4 + 1,iVar2);
  s = deFloatFrac(u - 0.5);
  local_8d = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x,0,iVar2);
    local_8d = bVar1 ^ 0xff;
  }
  local_a9 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar4,0,iVar2);
    local_a9 = bVar1 ^ 0xff;
  }
  if ((local_8d & 1) == 0) {
    iVar2 = Vector<int,_2>::y(offset);
    lookup((tcu *)(p1.m_data + 2),access,x,iVar2,0);
  }
  else {
    pTVar5 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p1.m_data + 2),pTVar5,sampler);
  }
  if ((local_a9 & 1) == 0) {
    iVar2 = Vector<int,_2>::y(offset);
    lookup((tcu *)local_6c,access,iVar4,iVar2,0);
  }
  else {
    pTVar5 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)local_6c,pTVar5,sampler);
  }
  operator*((tcu *)&local_7c,(Vector<float,_4> *)(p1.m_data + 2),1.0 - s);
  operator*((tcu *)&local_8c,(Vector<float,_4> *)local_6c,s);
  VVar6 = operator+(this,&local_7c,&local_8c);
  VVar7.m_data[0] = VVar6.m_data[0];
  VVar7.m_data[1] = VVar6.m_data[1];
  VVar7.m_data[2] = VVar6.m_data[2];
  VVar7.m_data[3] = VVar6.m_data[3];
  return (Vec4)VVar7.m_data;
}

Assistant:

static Vec4 sampleLinear1D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, const IVec2& offset)
{
	int w = access.getWidth();

	int x0 = deFloorFloatToInt32(u-0.5f)+offset.x();
	int x1 = x0+1;

	int i0 = wrap(sampler.wrapS, x0, w);
	int i1 = wrap(sampler.wrapS, x1, w);

	float a = deFloatFrac(u-0.5f);

	bool i0UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i0, 0, w);
	bool i1UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i1, 0, w);

	// Border color for out-of-range coordinates if using CLAMP_TO_BORDER, otherwise execute lookups.
	Vec4 p0 = i0UseBorder ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, offset.y(), 0);
	Vec4 p1 = i1UseBorder ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, offset.y(), 0);

	// Interpolate.
	return p0 * (1.0f - a) + p1 * a;
}